

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AuthenticatedStream> __thiscall
kj::ConnectionReceiver::acceptAuthenticated(ConnectionReceiver *this)

{
  undefined8 *in_RSI;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> local_20 [2];
  ConnectionReceiver *this_local;
  
  this_local = this;
  (**(code **)*in_RSI)();
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  then<kj::ConnectionReceiver::acceptAuthenticated()::__0>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)this,(Type *)local_20);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise(local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> ConnectionReceiver::acceptAuthenticated() {
  return accept().then([](Own<AsyncIoStream> stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}